

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool __thiscall
Lodtalk::MethodCompiler::generateOptimizedMessage
          (MethodCompiler *this,MessageSendNode *node,CompilerOptimizedSelector optimizedSelector)

{
  Node *pNVar1;
  Node *stepNode;
  uint uVar2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__x;
  Node *receiver_00;
  Oop OVar3;
  reference ppNVar4;
  Node *receiver;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> arguments;
  CompilerOptimizedSelector optimizedSelector_local;
  MessageSendNode *node_local;
  MethodCompiler *this_local;
  
  arguments.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = optimizedSelector;
  __x = AST::MessageSendNode::getArguments(node);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector
            ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)&receiver,__x);
  receiver_00 = AST::MessageSendNode::getReceiver(node);
  switch(arguments.super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
  case IfTrue:
    OVar3 = trueOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    generateIf(this,node,OVar3,receiver_00,*ppNVar4,false);
    break;
  case IfFalse:
    OVar3 = falseOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    generateIf(this,node,OVar3,receiver_00,*ppNVar4,false);
    break;
  case IfTrueIfFalse:
    OVar3 = trueOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    pNVar1 = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    generateIfElse(this,node,OVar3,receiver_00,pNVar1,*ppNVar4,false);
    break;
  case IfFalseIfTrue:
    OVar3 = falseOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    pNVar1 = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    generateIfElse(this,node,OVar3,receiver_00,pNVar1,*ppNVar4,false);
    break;
  case IfNil:
    OVar3 = nilOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    generateIf(this,node,OVar3,receiver_00,*ppNVar4,false);
    break;
  case IfNotNil:
    OVar3 = nilOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    generateIf(this,node,OVar3,receiver_00,*ppNVar4,true);
    break;
  case IfNilIfNotNil:
    OVar3 = nilOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    pNVar1 = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    generateIfElse(this,node,OVar3,receiver_00,pNVar1,*ppNVar4,false);
    break;
  case IfNotNilIfNil:
    OVar3 = nilOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    pNVar1 = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    generateIfElse(this,node,OVar3,receiver_00,pNVar1,*ppNVar4,true);
    break;
  case WhileTrue:
    uVar2 = (*receiver_00->_vptr_Node[5])();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a65e5;
    }
    OVar3 = trueOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    generateWhile(this,node,OVar3,receiver_00,*ppNVar4);
    break;
  case WhileFalse:
    uVar2 = (*receiver_00->_vptr_Node[5])();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a65e5;
    }
    OVar3 = falseOop();
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    generateWhile(this,node,OVar3,receiver_00,*ppNVar4);
    break;
  default:
    fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
            "bool Lodtalk::MethodCompiler::generateOptimizedMessage(MessageSendNode *, CompilerOptimizedSelector)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
            ,0x52c);
    abort();
  case ToByDo:
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,2);
    uVar2 = (*(*ppNVar4)->_vptr_Node[5])();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a65e5;
    }
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    pNVar1 = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    stepNode = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,2);
    generateToByDo(this,node,receiver_00,pNVar1,stepNode,*ppNVar4);
    break;
  case ToDo:
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    uVar2 = (*(*ppNVar4)->_vptr_Node[5])();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
      goto LAB_001a65e5;
    }
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,0);
    pNVar1 = *ppNVar4;
    ppNVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::operator[]
                        ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)
                         &receiver,1);
    generateToDo(this,node,receiver_00,pNVar1,*ppNVar4);
  }
  this_local._7_1_ = true;
LAB_001a65e5:
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::~vector
            ((vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *)&receiver);
  return this_local._7_1_;
}

Assistant:

bool MethodCompiler::generateOptimizedMessage(MessageSendNode *node, CompilerOptimizedSelector optimizedSelector)
{
    auto arguments = node->getArguments();
    auto receiver = node->getReceiver();

    switch(optimizedSelector)
    {
    case CompilerOptimizedSelector::IfTrue:
        generateIf(node, trueOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfFalse:
        generateIf(node, falseOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfNil:
        generateIf(node, nilOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::IfNotNil:
        generateIf(node, nilOop(), receiver, arguments[0], true);
        break;
    case CompilerOptimizedSelector::IfTrueIfFalse:
        generateIfElse(node, trueOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfFalseIfTrue:
        generateIfElse(node, falseOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfNilIfNotNil:
        generateIfElse(node, nilOop(), receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::IfNotNilIfNil:
        generateIfElse(node, nilOop(), receiver, arguments[0], arguments[1], true);
        break;
    case CompilerOptimizedSelector::WhileTrue:
        if(!receiver->isBlockExpression())
            return false;
        generateWhile(node, trueOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::WhileFalse:
        if(!receiver->isBlockExpression())
            return false;
        generateWhile(node, falseOop(), receiver, arguments[0]);
        break;
    case CompilerOptimizedSelector::ToDo:
        if(!arguments[1]->isBlockExpression())
            return false;
        generateToDo(node, receiver, arguments[0], arguments[1]);
        break;
    case CompilerOptimizedSelector::ToByDo:
        if(!arguments[2]->isBlockExpression())
            return false;
        generateToByDo(node, receiver, arguments[0], arguments[1], arguments[2]);
        break;
    default:
        LODTALK_UNIMPLEMENTED();
    }

    return true;
}